

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaFreeType(xmlSchemaTypePtr type)

{
  xmlSchemaAnnotPtr pxVar1;
  _xmlSchemaAnnot *p_Var2;
  _xmlSchemaAnnot *p_Var3;
  _xmlSchemaFacet *p_Var4;
  undefined8 *puVar5;
  _xmlSchemaTypeLink *p_Var6;
  _xmlSchemaFacetLink *p_Var7;
  xmlSchemaFacetPtr facet;
  xmlSchemaTypeLinkPtr pxVar8;
  xmlSchemaFacetLinkPtr pxVar9;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    return;
  }
  pxVar1 = type->annot;
  if (pxVar1 != (xmlSchemaAnnotPtr)0x0) {
    p_Var2 = pxVar1->next;
    (*xmlFree)(pxVar1);
    while (p_Var2 != (_xmlSchemaAnnot *)0x0) {
      p_Var3 = p_Var2->next;
      (*xmlFree)(p_Var2);
      p_Var2 = p_Var3;
    }
  }
  facet = type->facets;
  while (facet != (xmlSchemaFacetPtr)0x0) {
    p_Var4 = facet->next;
    xmlSchemaFreeFacet(facet);
    facet = p_Var4;
  }
  puVar5 = (undefined8 *)type->attrUses;
  if (puVar5 != (undefined8 *)0x0) {
    if ((void *)*puVar5 != (void *)0x0) {
      (*xmlFree)((void *)*puVar5);
    }
    (*xmlFree)(puVar5);
  }
  pxVar8 = type->memberTypes;
  while (pxVar8 != (xmlSchemaTypeLinkPtr)0x0) {
    p_Var6 = pxVar8->next;
    (*xmlFree)(pxVar8);
    pxVar8 = p_Var6;
  }
  pxVar9 = type->facetSet;
  while (pxVar9 != (xmlSchemaFacetLinkPtr)0x0) {
    p_Var7 = pxVar9->next;
    (*xmlFree)(pxVar9);
    pxVar9 = p_Var7;
  }
  if (type->contModel != (xmlRegexpPtr)0x0) {
    xmlRegFreeRegexp(type->contModel);
  }
  (*xmlFree)(type);
  return;
}

Assistant:

void
xmlSchemaFreeType(xmlSchemaTypePtr type)
{
    if (type == NULL)
        return;
    if (type->annot != NULL)
        xmlSchemaFreeAnnot(type->annot);
    if (type->facets != NULL) {
        xmlSchemaFacetPtr facet, next;

        facet = type->facets;
        while (facet != NULL) {
            next = facet->next;
            xmlSchemaFreeFacet(facet);
            facet = next;
        }
    }
    if (type->attrUses != NULL)
	xmlSchemaItemListFree((xmlSchemaItemListPtr) type->attrUses);
    if (type->memberTypes != NULL)
	xmlSchemaFreeTypeLinkList(type->memberTypes);
    if (type->facetSet != NULL) {
	xmlSchemaFacetLinkPtr next, link;

	link = type->facetSet;
	do {
	    next = link->next;
	    xmlFree(link);
	    link = next;
	} while (link != NULL);
    }
    if (type->contModel != NULL)
        xmlRegFreeRegexp(type->contModel);
    xmlFree(type);
}